

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_material
          (NodeLoader *this,instance_material__AttributeData *attributeData)

{
  GeometryMaterialIdInfo *this_00;
  ObjectId OVar1;
  undefined4 uVar2;
  MaterialId MVar3;
  MaterialBinding *pMVar4;
  UniqueId *pUVar5;
  allocator<char> local_41;
  String local_40;
  
  if (this->mCurrentInstanceController != (InstanceController *)0x0 ||
      this->mCurrentInstanceGeometry != (InstanceGeometry *)0x0) {
    if (attributeData->symbol == (char *)0x0) {
      MVar3 = 0;
    }
    else {
      this_00 = this->mCurrentMaterialInfo;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,attributeData->symbol,&local_41);
      MVar3 = GeometryMaterialIdInfo::getMaterialId(this_00,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    pMVar4 = (MaterialBinding *)operator_new(0x68);
    pUVar5 = IFilePartLoader::createUniqueIdFromUrl
                       (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                         super_IFilePartLoader,&attributeData->target,MATERIAL,false);
    pMVar4->mMaterialId = MVar3;
    uVar2 = *(undefined4 *)&pUVar5->field_0x4;
    OVar1 = pUVar5->mObjectId;
    (pMVar4->mReferencedMaterial).mClassId = pUVar5->mClassId;
    *(undefined4 *)&(pMVar4->mReferencedMaterial).field_0x4 = uVar2;
    (pMVar4->mReferencedMaterial).mObjectId = OVar1;
    (pMVar4->mReferencedMaterial).mFileId = pUVar5->mFileId;
    (pMVar4->mName)._M_dataplus._M_p = (pointer)&(pMVar4->mName).field_2;
    (pMVar4->mName)._M_string_length = 0;
    (pMVar4->mName).field_2._M_local_buf[0] = '\0';
    (pMVar4->mTextureCoordinateBindingArray)._vptr_Array = (_func_int **)&PTR_releaseMemory_00a036e0
    ;
    (pMVar4->mTextureCoordinateBindingArray).mData = (TextureCoordinateBinding *)0x0;
    (pMVar4->mTextureCoordinateBindingArray).mCount = 0;
    *(undefined8 *)((long)&(pMVar4->mTextureCoordinateBindingArray).mCount + 4) = 0;
    *(undefined8 *)((long)&(pMVar4->mTextureCoordinateBindingArray).mCapacity + 4) = 0;
    this->mCurrentMaterialBinding = pMVar4;
    if (attributeData->symbol != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,attributeData->symbol,&local_41);
      std::__cxx11::string::_M_assign((string *)&pMVar4->mName);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return true;
}

Assistant:

bool NodeLoader::begin__instance_material( const instance_material__AttributeData& attributeData )
	{
        if ( mCurrentInstanceGeometry || mCurrentInstanceController )
        {
            COLLADAFW::MaterialId materialId = attributeData.symbol ? mCurrentMaterialInfo->getMaterialId((const char*)attributeData.symbol) : 0;
            mCurrentMaterialBinding = new COLLADAFW::MaterialBinding(materialId, getHandlingFilePartLoader()->createUniqueIdFromUrl(attributeData.target, COLLADAFW::Material::ID()));

            if ( attributeData.symbol )
                mCurrentMaterialBinding->setName((const char*)attributeData.symbol);
        }

		return true;
	}